

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

LPVOID MapViewOfFileEx(HANDLE hFileMappingObject,DWORD dwDesiredAccess,DWORD dwFileOffsetHigh,
                      DWORD dwFileOffsetLow,SIZE_T dwNumberOfBytesToMap,LPVOID lpBaseAddress)

{
  LPVOID local_48;
  LPVOID pvMappedBaseAddress;
  CPalThread *pThread;
  LPVOID pvStack_30;
  PAL_ERROR palError;
  LPVOID lpBaseAddress_local;
  SIZE_T dwNumberOfBytesToMap_local;
  DWORD local_18;
  DWORD dwFileOffsetLow_local;
  DWORD dwFileOffsetHigh_local;
  DWORD dwDesiredAccess_local;
  HANDLE hFileMappingObject_local;
  
  pThread._4_4_ = 0;
  pvMappedBaseAddress = (LPVOID)0x0;
  local_48 = (LPVOID)0x0;
  pvStack_30 = lpBaseAddress;
  lpBaseAddress_local = (LPVOID)dwNumberOfBytesToMap;
  dwNumberOfBytesToMap_local._4_4_ = dwFileOffsetLow;
  local_18 = dwFileOffsetHigh;
  dwFileOffsetLow_local = dwDesiredAccess;
  _dwFileOffsetHigh_local = hFileMappingObject;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pvMappedBaseAddress = CorUnix::InternalGetCurrentThread();
  if (pvStack_30 == (LPVOID)0x0) {
    pThread._4_4_ =
         CorUnix::InternalMapViewOfFile
                   ((CPalThread *)pvMappedBaseAddress,_dwFileOffsetHigh_local,dwFileOffsetLow_local,
                    local_18,dwNumberOfBytesToMap_local._4_4_,(SIZE_T)lpBaseAddress_local,&local_48)
    ;
    if (pThread._4_4_ != 0) {
      CorUnix::CPalThread::SetLastError(pThread._4_4_);
    }
  }
  else {
    CorUnix::CPalThread::SetLastError(0x57);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_48;
  }
  abort();
}

Assistant:

LPVOID
PALAPI
MapViewOfFileEx(
          IN HANDLE hFileMappingObject,
          IN DWORD dwDesiredAccess,
          IN DWORD dwFileOffsetHigh,
          IN DWORD dwFileOffsetLow,
          IN SIZE_T dwNumberOfBytesToMap,
          IN LPVOID lpBaseAddress)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    LPVOID pvMappedBaseAddress = NULL;

    PERF_ENTRY(MapViewOfFileEx);
    ENTRY("MapViewOfFileEx(hFileMapping=%p, dwDesiredAccess=%u, "
          "dwFileOffsetH=%u, dwFileOffsetL=%u, dwNumberOfBytes=%u, lpBaseAddress=%p)\n",
          hFileMappingObject, dwDesiredAccess, dwFileOffsetHigh,
          dwFileOffsetLow, dwNumberOfBytesToMap, lpBaseAddress);

    pThread = InternalGetCurrentThread();

    if (lpBaseAddress == NULL)
    {
        palError = InternalMapViewOfFile(
            pThread,
            hFileMappingObject,
            dwDesiredAccess,
            dwFileOffsetHigh,
            dwFileOffsetLow,
            dwNumberOfBytesToMap,
            &pvMappedBaseAddress
            );

        if (NO_ERROR != palError)
        {
            pThread->SetLastError(palError);
        }
    }
    else
    {
        // TODO: Figure out if we can support mapping at a specific address on Linux.
        pThread->SetLastError(ERROR_INVALID_PARAMETER);       
    }

    LOGEXIT( "MapViewOfFileEx returning %p.\n", pvMappedBaseAddress );
    PERF_EXIT(MapViewOfFileEx);
    return pvMappedBaseAddress;
}